

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

cmValue __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  FileSetType *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __type _Var1;
  bool bVar2;
  int iVar3;
  TargetType targetType;
  size_type sVar4;
  pointer ppVar5;
  pointer pcVar6;
  size_type __new_size;
  string *psVar7;
  cmState *this_02;
  pair<bool,_cmValue> pVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_650;
  cmStateSnapshot local_638;
  cmStateDirectory local_620;
  byte local_5f1;
  cmValue cStack_5f0;
  bool chain;
  cmValue retVal;
  pair<bool,_cmValue> value_1;
  FileSetType *fileSetType;
  FileSetType **__end1;
  FileSetType **__begin1;
  FileSetType *(*__range1) [2];
  FileSetType *fileSetTypes [2];
  cmStateSnapshot local_5a0;
  cmStateDirectory local_588;
  cmStateSnapshot local_560;
  cmStateDirectory local_548;
  string local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f0;
  _Base_ptr local_4e8;
  _Base_ptr local_4e0;
  undefined1 local_4d8;
  pair<bool,_cmValue> value;
  UsageRequirementProperty *usageRequirement;
  UsageRequirementProperty **__end2;
  UsageRequirementProperty **__begin2;
  UsageRequirementProperty *(*__range2) [17];
  UsageRequirementProperty *usageRequirements [17];
  _Self local_418;
  _Self local_410;
  iterator propertyIter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  string *prop_local;
  cmTarget *this_local;
  
  local_20 = (undefined1  [8])prop;
  prop_local = (string *)this;
  if ((GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                                 ), iVar3 != 0)) {
    std::__cxx11::string::string
              ((string *)&local_3f0,(string *)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_3d0,(string *)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_3b0,(string *)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_390,(string *)(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_370,(string *)(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_350,(string *)(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_330,(string *)(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
    std::__cxx11::string::string(local_310,(string *)(anonymous_namespace)::propTYPE_abi_cxx11_);
    std::__cxx11::string::string
              (local_2f0,(string *)(anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_2d0,(string *)(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_);
    std::__cxx11::string::string
              (local_2b0,(string *)(anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_290,(string *)(anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_270,(string *)(anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_);
    std::__cxx11::string::string
              (local_250,(string *)(anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_230,(string *)(anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_);
    std::__cxx11::string::string(local_210,(string *)(anonymous_namespace)::propIMPORTED_abi_cxx11_)
    ;
    std::__cxx11::string::string
              (local_1f0,(string *)(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
    std::__cxx11::string::string
              (local_1d0,(string *)(anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
              );
    std::__cxx11::string::string(local_1b0,(string *)(anonymous_namespace)::propNAME_abi_cxx11_);
    std::__cxx11::string::string
              (local_190,(string *)(anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
    std::__cxx11::string::string
              (local_170,(string *)(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
    std::__cxx11::string::string(local_150,(string *)(anonymous_namespace)::propSOURCES_abi_cxx11_);
    std::__cxx11::string::string
              (local_130,(string *)(anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_110,
               (string *)(anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
    std::__cxx11::string::string
              (local_f0,(string *)
                        (anonymous_namespace)::
                        propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
    std::__cxx11::string::string
              (local_d0,(string *)
                        (anonymous_namespace)::
                        propIMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_b0,(string *)
                        (anonymous_namespace)::
                        propIMPORTED_CXX_MODULES_COMPILE_DEFINITIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_90,(string *)
                        (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_FEATURES_abi_cxx11_)
    ;
    std::__cxx11::string::string
              (local_70,(string *)
                        (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_50,(string *)
                        (anonymous_namespace)::propIMPORTED_CXX_MODULES_LINK_LIBRARIES_abi_cxx11_);
    local_30 = &local_3f0;
    local_28 = 0x1e;
    this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&propertyIter._M_node + 1);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this_00);
    __l._M_len = local_28;
    __l._M_array = local_30;
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::unordered_set(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,__l,0,
                    (hasher *)((long)&propertyIter._M_node + 3),
                    (key_equal *)((long)&propertyIter._M_node + 2),this_00);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&propertyIter._M_node + 1));
    local_650 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
    do {
      local_650 = local_650 + -1;
      std::__cxx11::string::~string((string *)local_650);
    } while (local_650 != &local_3f0);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
  }
  sVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                  (key_type *)local_20);
  if (sVar4 != 0) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
    if (((((_Var1) ||
          (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_20,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_), _Var1))
         || (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_20,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_), _Var1)
         ) || ((_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_20,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_),
               _Var1 || (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_20,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propOBJC_STANDARD_abi_cxx11_), _Var1)))) ||
       (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_20,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_), _Var1)) {
      pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      local_410._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::find(&pcVar6->LanguageStandardProperties,(key_type *)local_20);
      pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      local_418._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::end(&pcVar6->LanguageStandardProperties);
      bVar2 = std::operator==(&local_410,&local_418);
      if (!bVar2) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator->(&local_410);
        cmValue::cmValue((cmValue *)&this_local,&(ppVar5->second).Value);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    __range2 = (UsageRequirementProperty *(*) [17])&pcVar6->IncludeDirectories;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[0] = &pcVar6->CompileOptions;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[1] = &pcVar6->CompileFeatures;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[2] = &pcVar6->CompileDefinitions;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[3] = &pcVar6->PrecompileHeaders;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[4] = &pcVar6->Sources;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[5] = &pcVar6->LinkOptions;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[6] = &pcVar6->LinkDirectories;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[7] = &pcVar6->LinkLibraries;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[8] = &pcVar6->InterfaceLinkLibraries;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[9] = &pcVar6->InterfaceLinkLibrariesDirect;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[10] = &pcVar6->InterfaceLinkLibrariesDirectExclude;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[0xb] = &pcVar6->ImportedCxxModulesIncludeDirectories;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[0xc] = &pcVar6->ImportedCxxModulesCompileDefinitions;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[0xd] = &pcVar6->ImportedCxxModulesCompileFeatures;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[0xe] = &pcVar6->ImportedCxxModulesCompileOptions;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    usageRequirements[0xf] = &pcVar6->ImportedCxxModulesLinkLibraries;
    for (__end2 = (UsageRequirementProperty **)&__range2; __end2 != usageRequirements + 0x10;
        __end2 = __end2 + 1) {
      value.second.Value = (string *)*__end2;
      pVar8 = anon_unknown.dwarf_94103c::UsageRequirementProperty::Read
                        ((UsageRequirementProperty *)value.second.Value,(string *)local_20);
      value._0_8_ = pVar8.second.Value;
      local_4d8 = pVar8.first;
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (cmValue)(string *)value._0_8_;
      }
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propTYPE_abi_cxx11_);
    if (_Var1) {
      targetType = GetType(this);
      psVar7 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
      cmValue::cmValue((cmValue *)&this_local,psVar7);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::
                                        propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    if (_Var1) {
      pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
              ::empty(&pcVar6->Utilities);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        if ((GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                         utilities_abi_cxx11_), iVar3 != 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_);
          __cxa_atexit(std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::~vector,&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_);
        }
        pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        __new_size = std::
                     set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                     ::size(&pcVar6->Utilities);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,__new_size);
        pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        local_4e0 = (_Base_ptr)
                    std::
                    set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                    ::cbegin(&pcVar6->Utilities);
        pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        local_4e8 = (_Base_ptr)
                    std::
                    set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                    ::cend(&pcVar6->Utilities);
        local_4f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_);
        local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    transform<std::_Rb_tree_const_iterator<BT<std::pair<std::__cxx11::string,bool>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmTarget::GetProperty(std::__cxx11::string_const&)const::__0>
                              (local_4e0,local_4e8,local_4f0);
        cmList::
        to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  (&local_520,&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_520);
        std::__cxx11::string::~string((string *)&local_520);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propIMPORTED_abi_cxx11_);
    if (_Var1) {
      bVar2 = IsImported(this);
      if (!bVar2) {
        cmValue::cmValue((cmValue *)&this_local,
                         (string *)(anonymous_namespace)::propFALSE_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(string *)(anonymous_namespace)::propTRUE_abi_cxx11_);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
    if (_Var1) {
      bVar2 = IsImportedGloballyVisible(this);
      if (!bVar2) {
        cmValue::cmValue((cmValue *)&this_local,
                         (string *)(anonymous_namespace)::propFALSE_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(string *)(anonymous_namespace)::propTRUE_abi_cxx11_);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propNAME_abi_cxx11_);
    if (_Var1) {
      psVar7 = GetName_abi_cxx11_(this);
      cmValue::cmValue((cmValue *)&this_local,psVar7);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
    if (_Var1) {
      pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      cmMakefile::GetStateSnapshot(&local_560,pcVar6->Makefile);
      cmStateSnapshot::GetDirectory(&local_548,&local_560);
      psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_548);
      cmValue::cmValue((cmValue *)&this_local,psVar7);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
    if (_Var1) {
      pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      cmMakefile::GetStateSnapshot(&local_5a0,pcVar6->Makefile);
      cmStateSnapshot::GetDirectory(&local_588,&local_5a0);
      psVar7 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_588);
      cmValue::cmValue((cmValue *)&this_local,psVar7);
      return (cmValue)(string *)this_local;
    }
  }
  pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  __range1 = (FileSetType *(*) [2])&pcVar6->HeadersFileSets;
  pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  fileSetTypes[0] = &pcVar6->CxxModulesFileSets;
  __end1 = (FileSetType **)&__range1;
  while( true ) {
    if (__end1 == fileSetTypes + 1) {
      pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      cStack_5f0 = cmPropertyMap::GetPropertyValue(&pcVar6->Properties,(string *)local_20);
      bVar2 = cmValue::operator_cast_to_bool(&stack0xfffffffffffffa10);
      if (bVar2) {
        this_local = (cmTarget *)cStack_5f0.Value;
      }
      else {
        pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        this_02 = cmMakefile::GetState(pcVar6->Makefile);
        local_5f1 = cmState::IsPropertyChained(this_02,(string *)local_20,TARGET);
        if ((bool)local_5f1) {
          pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                   operator->(&this->impl);
          cmMakefile::GetStateSnapshot(&local_638,pcVar6->Makefile);
          cmStateSnapshot::GetDirectory(&local_620,&local_638);
          this_local = (cmTarget *)
                       cmStateDirectory::GetProperty
                                 (&local_620,(string *)local_20,(bool)(local_5f1 & 1));
        }
        else {
          cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
        }
      }
      return (cmValue)(string *)this_local;
    }
    this_01 = *__end1;
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::get
                       (&this->impl);
    pVar8 = anon_unknown.dwarf_94103c::FileSetType::ReadProperties
                      (this_01,this,pcVar6,(string *)local_20);
    retVal.Value._0_1_ = pVar8.first;
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
    __end1 = __end1 + 1;
  }
  return (cmValue)pVar8.second.Value.Value;
}

Assistant:

cmValue cmTarget::GetProperty(const std::string& prop) const
{
  static std::unordered_set<std::string> const specialProps{
    propC_STANDARD,
    propCXX_STANDARD,
    propCUDA_STANDARD,
    propHIP_STANDARD,
    propOBJC_STANDARD,
    propOBJCXX_STANDARD,
    propLINK_LIBRARIES,
    propTYPE,
    propINCLUDE_DIRECTORIES,
    propCOMPILE_FEATURES,
    propCOMPILE_OPTIONS,
    propCOMPILE_DEFINITIONS,
    propPRECOMPILE_HEADERS,
    propLINK_OPTIONS,
    propLINK_DIRECTORIES,
    propIMPORTED,
    propIMPORTED_GLOBAL,
    propMANUALLY_ADDED_DEPENDENCIES,
    propNAME,
    propBINARY_DIR,
    propSOURCE_DIR,
    propSOURCES,
    propINTERFACE_LINK_LIBRARIES,
    propINTERFACE_LINK_LIBRARIES_DIRECT,
    propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
    propIMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES,
    propIMPORTED_CXX_MODULES_COMPILE_DEFINITIONS,
    propIMPORTED_CXX_MODULES_COMPILE_FEATURES,
    propIMPORTED_CXX_MODULES_COMPILE_OPTIONS,
    propIMPORTED_CXX_MODULES_LINK_LIBRARIES,
  };
  if (specialProps.count(prop)) {
    if (prop == propC_STANDARD || prop == propCXX_STANDARD ||
        prop == propCUDA_STANDARD || prop == propHIP_STANDARD ||
        prop == propOBJC_STANDARD || prop == propOBJCXX_STANDARD) {
      auto propertyIter = this->impl->LanguageStandardProperties.find(prop);
      if (propertyIter == this->impl->LanguageStandardProperties.end()) {
        return nullptr;
      }
      return cmValue(propertyIter->second.Value);
    }

    UsageRequirementProperty const* usageRequirements[] = {
      &this->impl->IncludeDirectories,
      &this->impl->CompileOptions,
      &this->impl->CompileFeatures,
      &this->impl->CompileDefinitions,
      &this->impl->PrecompileHeaders,
      &this->impl->Sources,
      &this->impl->LinkOptions,
      &this->impl->LinkDirectories,
      &this->impl->LinkLibraries,
      &this->impl->InterfaceLinkLibraries,
      &this->impl->InterfaceLinkLibrariesDirect,
      &this->impl->InterfaceLinkLibrariesDirectExclude,
      &this->impl->ImportedCxxModulesIncludeDirectories,
      &this->impl->ImportedCxxModulesCompileDefinitions,
      &this->impl->ImportedCxxModulesCompileFeatures,
      &this->impl->ImportedCxxModulesCompileOptions,
      &this->impl->ImportedCxxModulesLinkLibraries,
    };

    for (auto const* usageRequirement : usageRequirements) {
      auto value = usageRequirement->Read(prop);
      if (value.first) {
        return value.second;
      }
    }

    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmValue(cmState::GetTargetTypeName(this->GetType()));
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (this->impl->Utilities.empty()) {
        return nullptr;
      }

      static std::string output;
      static std::vector<std::string> utilities;
      utilities.resize(this->impl->Utilities.size());
      std::transform(
        this->impl->Utilities.cbegin(), this->impl->Utilities.cend(),
        utilities.begin(),
        [](const BT<std::pair<std::string, bool>>& item) -> std::string {
          return item.Value.first;
        });
      output = cmList::to_string(utilities);
      return cmValue(output);
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? cmValue(propTRUE) : cmValue(propFALSE);
    }
    if (prop == propIMPORTED_GLOBAL) {
      return this->IsImportedGloballyVisible() ? cmValue(propTRUE)
                                               : cmValue(propFALSE);
    }
    if (prop == propNAME) {
      return cmValue(this->GetName());
    }
    if (prop == propBINARY_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentBinary());
    }
    if (prop == propSOURCE_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentSource());
    }
  }

  // Check fileset properties.
  {
    FileSetType* fileSetTypes[] = {
      &this->impl->HeadersFileSets,
      &this->impl->CxxModulesFileSets,
    };

    for (auto* fileSetType : fileSetTypes) {
      auto value = fileSetType->ReadProperties(this, this->impl.get(), prop);
      if (value.first) {
        return value.second;
      }
    }
  }

  cmValue retVal = this->impl->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain = this->impl->Makefile->GetState()->IsPropertyChained(
      prop, cmProperty::TARGET);
    if (chain) {
      return this->impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetProperty(prop, chain);
    }
    return nullptr;
  }
  return retVal;
}